

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c
# Opt level: O3

_Bool read_line(bufchain *input,strbuf *output,_Bool is_header)

{
  _Bool _Var1;
  char c;
  uchar local_29;
  
  _Var1 = bufchain_try_fetch(input,&local_29,1);
  if (_Var1) {
    do {
      if (is_header) {
        if ((output->len == 0) || (output->s[output->len - 1] != '\n')) {
          BinarySink_put_byte(output->binarysink_,local_29);
          bufchain_consume(input,1);
        }
        else if ((local_29 != '\t') && (local_29 != ' ')) goto LAB_0011a2fa;
      }
      else {
        BinarySink_put_byte(output->binarysink_,local_29);
        bufchain_consume(input,1);
        if ((output->len != 0) && (output->s[output->len - 1] == '\n')) {
LAB_0011a2fa:
          strbuf_chomp(output,'\n');
          strbuf_chomp(output,'\r');
          return true;
        }
      }
      _Var1 = bufchain_try_fetch(input,&local_29,1);
    } while (_Var1);
  }
  return false;
}

Assistant:

static bool read_line(bufchain *input, strbuf *output, bool is_header)
{
    char c;

    while (bufchain_try_fetch(input, &c, 1)) {
        if (is_header && output->len > 0 &&
            output->s[output->len - 1] == '\n') {
            /*
             * A newline terminates the header, provided we're sure it
             * is _not_ followed by a space or a tab.
             */
            if (c != ' ' && c != '\t')
                goto done;  /* we have a complete header line */
        } else {
            put_byte(output, c);
            bufchain_consume(input, 1);

            if (!is_header && output->len > 0 &&
                output->s[output->len - 1] == '\n') {
                /* If we're looking for just a line, not an HTTP
                 * header, then any newline terminates it. */
                goto done;
            }
        }
    }

    return false;

  done:
    strbuf_chomp(output, '\n');
    strbuf_chomp(output, '\r');
    return true;
}